

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtCof0IsConst0(word *t,int nWords,int iVar)

{
  int iVar1;
  word *tLimit;
  int local_28;
  int Step;
  int i_1;
  int i;
  int iVar_local;
  int nWords_local;
  word *t_local;
  
  if (iVar < 6) {
    for (Step = 0; Step < nWords; Step = Step + 1) {
      if ((t[Step] & s_Truths6Neg[iVar]) != 0) {
        return 0;
      }
    }
  }
  else {
    iVar1 = 1 << ((char)iVar - 6U & 0x1f);
    for (_iVar_local = t; _iVar_local < t + nWords; _iVar_local = _iVar_local + (iVar1 << 1)) {
      for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
        if (_iVar_local[local_28] != 0) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

static inline int Abc_TtCof0IsConst0( word * t, int nWords, int iVar ) 
{ 
    if ( iVar < 6 )
    {
        int i;
        for ( i = 0; i < nWords; i++ )
            if ( t[i] & s_Truths6Neg[iVar] )
                return 0;
        return 1;
    }
    else
    {
        int i, Step = (1 << (iVar - 6));
        word * tLimit = t + nWords;
        for ( ; t < tLimit; t += 2*Step )
            for ( i = 0; i < Step; i++ )
                if ( t[i] )
                    return 0;
        return 1;
    }
}